

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O2

int base64_stream_decode_avx(base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  undefined8 in_R11;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  uint8_t *o;
  byte *local_60;
  uint local_54;
  ulong local_50;
  base64_state *local_48;
  size_t *local_40;
  size_t local_38;
  
  iVar2 = state->eof;
  if (iVar2 != 0) {
    *outlen = 0;
    if (iVar2 == 1 && srclen != 0) {
      state->eof = 2;
      state->bytes = 0;
      bVar4 = srclen == 1 && base64_table_dec_8bit[(byte)*src] == 0xfe;
    }
    else {
      bVar4 = false;
    }
    goto LAB_00104c36;
  }
  uVar6 = CONCAT71((int7)((ulong)in_R11 >> 8),state->carry);
  uVar5 = state->bytes;
  iVar2 = 0;
  local_38 = 0;
  pbVar3 = (byte *)out;
  uVar7 = (ulong)uVar5;
  sVar8 = srclen;
  o = (uint8_t *)out;
  local_60 = (byte *)src;
  local_48 = state;
  local_40 = outlen;
  switch((ulong)uVar5) {
  case 0:
switchD_00104995_caseD_0:
    local_38 = uVar7;
    if (0x17 < srclen) {
      local_54 = (uint)uVar6;
      uVar7 = srclen - 8 >> 4;
      local_50 = uVar7;
      do {
        uVar6 = local_50;
        if (local_50 < 8) {
          if (3 < local_50) goto LAB_00104a60;
          iVar2 = dec_loop_ssse3_inner(&local_60,&o,&local_50);
          if (uVar6 < 2) goto LAB_00104aba;
        }
        else {
          iVar2 = dec_loop_ssse3_inner(&local_60,&o,&local_50);
          if ((((iVar2 == 0) || (iVar2 = dec_loop_ssse3_inner(&local_60,&o,&local_50), iVar2 == 0))
              || (iVar2 = dec_loop_ssse3_inner(&local_60,&o,&local_50), iVar2 == 0)) ||
             (iVar2 = dec_loop_ssse3_inner(&local_60,&o,&local_50), iVar2 == 0)) goto LAB_00104aba;
LAB_00104a60:
          iVar2 = dec_loop_ssse3_inner(&local_60,&o,&local_50);
          if ((iVar2 == 0) || (iVar2 = dec_loop_ssse3_inner(&local_60,&o,&local_50), iVar2 == 0))
          goto LAB_00104aba;
          iVar2 = dec_loop_ssse3_inner(&local_60,&o,&local_50);
        }
        if (((iVar2 == 0) || (iVar2 = dec_loop_ssse3_inner(&local_60,&o,&local_50), iVar2 == 0)) ||
           (local_50 == 0)) goto LAB_00104aba;
      } while( true );
    }
    goto LAB_00104adc;
  case 1:
    goto switchD_00104995_caseD_1;
  case 2:
    goto switchD_00104995_caseD_2;
  case 3:
    goto switchD_00104995_caseD_3;
  default:
    bVar4 = false;
  }
  goto LAB_00104c24;
LAB_00104aba:
  srclen = (srclen - (srclen - 8 & 0xfffffffffffffff0)) + local_50 * 0x10;
  local_38 = (uVar7 - local_50) * 0xc + local_38;
  uVar6 = (ulong)local_54;
  outlen = local_40;
LAB_00104adc:
  bVar4 = srclen == 0;
  srclen = srclen - 1;
  if (bVar4) {
    uVar5 = 0;
  }
  else {
    if (0xfd < base64_table_dec_8bit[*local_60]) {
      bVar4 = false;
      goto LAB_00104c0e;
    }
    src = (char *)(local_60 + 1);
    uVar6 = (ulong)(byte)(base64_table_dec_8bit[*local_60] << 2);
switchD_00104995_caseD_1:
    uVar5 = 1;
    sVar8 = srclen - 1;
    if (srclen != 0) {
      bVar1 = base64_table_dec_8bit[(byte)*src];
      if (0xfd < bVar1) {
        bVar4 = false;
        goto LAB_00104c15;
      }
      src = (char *)((byte *)src + 1);
      pbVar3 = o + 1;
      *o = bVar1 >> 4 | (byte)uVar6;
      local_38 = local_38 + 1;
      uVar6 = (ulong)(byte)(bVar1 << 4);
switchD_00104995_caseD_2:
      bVar4 = true;
      srclen = sVar8 - 1;
      if (sVar8 == 0) {
        uVar5 = 2;
      }
      else {
        bVar1 = base64_table_dec_8bit[(byte)*src];
        if (bVar1 < 0xfe) {
          src = (char *)((byte *)src + 1);
          out = (char *)(pbVar3 + 1);
          *pbVar3 = bVar1 >> 2 | (byte)uVar6;
          local_38 = local_38 + 1;
          uVar6 = (ulong)(byte)(bVar1 << 6);
switchD_00104995_caseD_3:
          bVar4 = srclen != 0;
          srclen = srclen - 1;
          if (bVar4) {
            local_60 = (byte *)src + 1;
            bVar1 = base64_table_dec_8bit[(byte)*src];
            if (0xfd < bVar1) goto code_r0x00104bbd;
            o = (byte *)out + 1;
            *out = bVar1 | (byte)uVar6;
            uVar6 = 0;
            uVar7 = local_38 + 1;
            goto switchD_00104995_caseD_0;
          }
          bVar4 = true;
        }
        else {
          if (bVar1 == 0xfe) {
            if (srclen == 0) {
              uVar5 = 3;
              iVar2 = 1;
            }
            else {
              bVar4 = sVar8 == 2 && base64_table_dec_8bit[((byte *)src)[1]] == 0xfe;
              iVar2 = 2;
              uVar5 = 0;
            }
            goto LAB_00104c24;
          }
          bVar4 = false;
        }
        uVar5 = 3;
      }
      goto LAB_00104c22;
    }
  }
  bVar4 = true;
LAB_00104c22:
  iVar2 = 0;
  goto LAB_00104c24;
code_r0x00104bbd:
  bVar4 = srclen == 0 && bVar1 == 0xfe;
LAB_00104c0e:
  uVar5 = 0;
LAB_00104c15:
  iVar2 = 2;
LAB_00104c24:
  local_48->eof = iVar2;
  local_48->bytes = uVar5;
  local_48->carry = (uchar)uVar6;
  *outlen = local_38;
LAB_00104c36:
  return (int)bVar4;
}

Assistant:

BASE64_DEC_FUNCTION(avx)
{
#if HAVE_AVX
	#include "../generic/dec_head.c"
	dec_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/dec_tail.c"
#else
	BASE64_DEC_STUB
#endif
}